

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DigitTest.hpp
# Opt level: O3

void Qentem::Test::TestStringToNumber1(QTest *test)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  double d_number;
  SizeT64 number;
  undefined8 local_40;
  double local_38;
  unsigned_long_long local_30;
  
  local_30 = 0;
  local_38 = 0.0;
  uVar1._0_1_ = test->error_;
  uVar1._1_1_ = test->continue_on_error_;
  uVar1._2_2_ = *(undefined2 *)&test->field_0x1a;
  bVar11 = StringToNumber<unsigned_long_long>
                     ((Test *)(ulong)uVar1,(QTest *)(ulong)test->continue_on_error_,&local_30,"");
  QTest::IsFalse(test,bVar11,0x9a);
  uVar2._0_1_ = test->error_;
  uVar2._1_1_ = test->continue_on_error_;
  uVar2._2_2_ = *(undefined2 *)&test->field_0x1a;
  bVar11 = StringToNumber<unsigned_long_long>
                     ((Test *)(ulong)uVar2,(QTest *)(ulong)test->continue_on_error_,&local_30,"0");
  QTest::IsTrue(test,bVar11,0x9d);
  local_40 = (double)((ulong)local_40._4_4_ << 0x20);
  QTest::IsEqual<unsigned_long_long,unsigned_int>(test,&local_30,(uint *)&local_40,0x9e);
  uVar3._0_1_ = test->error_;
  uVar3._1_1_ = test->continue_on_error_;
  uVar3._2_2_ = *(undefined2 *)&test->field_0x1a;
  bVar11 = StringToNumber<double>
                     ((Test *)(ulong)uVar3,(QTest *)(ulong)test->continue_on_error_,&local_38,"0.0")
  ;
  QTest::IsTrue(test,bVar11,0xa1);
  local_40 = 0.0;
  QTest::IsEqual<double,double>(test,&local_38,(double *)&local_40,0xa2);
  uVar4._0_1_ = test->error_;
  uVar4._1_1_ = test->continue_on_error_;
  uVar4._2_2_ = *(undefined2 *)&test->field_0x1a;
  bVar11 = StringToNumber<double>
                     ((Test *)(ulong)uVar4,(QTest *)(ulong)test->continue_on_error_,&local_38,"-0");
  QTest::IsTrue(test,bVar11,0xa5);
  local_40 = -0.0;
  QTest::IsEqual<double,double>(test,&local_38,(double *)&local_40,0xa6);
  uVar5._0_1_ = test->error_;
  uVar5._1_1_ = test->continue_on_error_;
  uVar5._2_2_ = *(undefined2 *)&test->field_0x1a;
  bVar11 = StringToNumber<double>
                     ((Test *)(ulong)uVar5,(QTest *)(ulong)test->continue_on_error_,&local_38,"-0.0"
                     );
  QTest::IsTrue(test,bVar11,0xa9);
  local_40 = -0.0;
  QTest::IsEqual<double,double>(test,&local_38,(double *)&local_40,0xaa);
  uVar6._0_1_ = test->error_;
  uVar6._1_1_ = test->continue_on_error_;
  uVar6._2_2_ = *(undefined2 *)&test->field_0x1a;
  bVar11 = StringToNumber<unsigned_long_long>
                     ((Test *)(ulong)uVar6,(QTest *)(ulong)test->continue_on_error_,&local_30,"1");
  QTest::IsTrue(test,bVar11,0xad);
  local_40._0_4_ = 1;
  QTest::IsEqual<unsigned_long_long,unsigned_int>(test,&local_30,(uint *)&local_40,0xae);
  uVar7._0_1_ = test->error_;
  uVar7._1_1_ = test->continue_on_error_;
  uVar7._2_2_ = *(undefined2 *)&test->field_0x1a;
  bVar11 = StringToNumber<unsigned_long_long>
                     ((Test *)(ulong)uVar7,(QTest *)(ulong)test->continue_on_error_,&local_30,
                      "1000000");
  QTest::IsTrue(test,bVar11,0xb1);
  local_40._0_4_ = 1000000;
  QTest::IsEqual<unsigned_long_long,unsigned_int>(test,&local_30,(uint *)&local_40,0xb2);
  uVar8._0_1_ = test->error_;
  uVar8._1_1_ = test->continue_on_error_;
  uVar8._2_2_ = *(undefined2 *)&test->field_0x1a;
  bVar11 = StringToNumber<unsigned_long_long>
                     ((Test *)(ulong)uVar8,(QTest *)(ulong)test->continue_on_error_,&local_30,
                      "1010101");
  QTest::IsTrue(test,bVar11,0xb5);
  local_40._0_4_ = 0xf69b5;
  QTest::IsEqual<unsigned_long_long,unsigned_int>(test,&local_30,(uint *)&local_40,0xb6);
  uVar9._0_1_ = test->error_;
  uVar9._1_1_ = test->continue_on_error_;
  uVar9._2_2_ = *(undefined2 *)&test->field_0x1a;
  bVar11 = StringToNumber<unsigned_long_long>
                     ((Test *)(ulong)uVar9,(QTest *)(ulong)test->continue_on_error_,&local_30,
                      "9999999");
  QTest::IsTrue(test,bVar11,0xb9);
  local_40._0_4_ = 9999999;
  QTest::IsEqual<unsigned_long_long,unsigned_int>(test,&local_30,(uint *)&local_40,0xba);
  uVar10._0_1_ = test->error_;
  uVar10._1_1_ = test->continue_on_error_;
  uVar10._2_2_ = *(undefined2 *)&test->field_0x1a;
  bVar11 = StringToNumber<unsigned_long_long>
                     ((Test *)(ulong)uVar10,(QTest *)(ulong)test->continue_on_error_,&local_30,
                      "123456789");
  QTest::IsTrue(test,bVar11,0xbd);
  local_40 = (double)CONCAT44(local_40._4_4_,0x75bcd15);
  QTest::IsEqual<unsigned_long_long,unsigned_int>(test,&local_30,(uint *)&local_40,0xbe);
  return;
}

Assistant:

static void TestStringToNumber1(QTest &test) {
    SizeT64     number   = 0;
    double      d_number = 0;
    const char *str;

    str = "";
    test.IsFalse(StringToNumber(test, number, str), __LINE__);

    str = "0";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 0U, __LINE__);

    str = "0.0";
    test.IsTrue(StringToNumber(test, d_number, str), __LINE__);
    test.IsEqual(d_number, 0.0, __LINE__);

    str = "-0";
    test.IsTrue(StringToNumber(test, d_number, str), __LINE__);
    test.IsEqual(d_number, -0.0, __LINE__);

    str = "-0.0";
    test.IsTrue(StringToNumber(test, d_number, str), __LINE__);
    test.IsEqual(d_number, -0.0, __LINE__);

    str = "1";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 1U, __LINE__);

    str = "1000000";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 1000000U, __LINE__);

    str = "1010101";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 1010101U, __LINE__);

    str = "9999999";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 9999999U, __LINE__);

    str = "123456789";
    test.IsTrue(StringToNumber(test, number, str), __LINE__);
    test.IsEqual(number, 123456789U, __LINE__);
}